

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O3

void __thiscall QPainter::drawConvexPolygon(QPainter *this,QPoint *points,int pointCount)

{
  _Head_base<0UL,_QPainterPrivate_*,_false> this_00;
  ulong uVar1;
  QPaintEngine *pQVar2;
  long in_FS_OFFSET;
  QPainterPath polygonPath;
  QPointF local_58;
  QPainterPath local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((pointCount < 2) ||
     (this_00._M_head_impl =
           (this->d_ptr)._M_t.
           super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
           super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl,
     ((this_00._M_head_impl)->engine)._M_t.
     super___uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>._M_t.
     super__Tuple_impl<0UL,_QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>.
     super__Head_base<0UL,_QPaintEngine_*,_false>._M_head_impl == (QPaintEngine *)0x0)) {
LAB_003d4d1a:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    pQVar2 = &(this_00._M_head_impl)->extended->super_QPaintEngine;
    if (pQVar2 == (QPaintEngine *)0x0) {
      QPainterPrivate::updateState
                (this_00._M_head_impl,
                 ((this_00._M_head_impl)->state)._M_t.
                 super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
                 super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
                 super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl);
      if ((((this_00._M_head_impl)->state)._M_t.
           super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
           super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
           super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl)->emulationSpecifier != 0) {
        local_40.d_ptr.d.ptr =
             (QExplicitlySharedDataPointer<QPainterPathPrivate>)&DAT_aaaaaaaaaaaaaaaa;
        local_58.xp = (qreal)(*points).xp.m_i;
        local_58.yp = (qreal)(*points).yp.m_i;
        QPainterPath::QPainterPath(&local_40,&local_58);
        uVar1 = 1;
        do {
          local_58.xp = (qreal)points[uVar1].xp.m_i;
          local_58.yp = (qreal)points[uVar1].yp.m_i;
          QPainterPath::lineTo(&local_40,&local_58);
          uVar1 = uVar1 + 1;
        } while ((uint)pointCount != uVar1);
        QPainterPath::closeSubpath(&local_40);
        QPainterPath::setFillRule(&local_40,WindingFill);
        QPainterPrivate::draw_helper(this_00._M_head_impl,&local_40,StrokeAndFillDraw);
        QPainterPath::~QPainterPath(&local_40);
        goto LAB_003d4d1a;
      }
      pQVar2 = ((this_00._M_head_impl)->engine)._M_t.
               super___uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>._M_t.
               super__Tuple_impl<0UL,_QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>.
               super__Head_base<0UL,_QPaintEngine_*,_false>._M_head_impl;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (*((QPaintEngine *)&pQVar2->_vptr_QPaintEngine)->_vptr_QPaintEngine[0xf])
                (pQVar2,points,(ulong)(uint)pointCount,2);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QPainter::drawConvexPolygon(const QPoint *points, int pointCount)
{
#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::drawConvexPolygon(), count=%d\n", pointCount);
#endif

    Q_D(QPainter);

    if (!d->engine || pointCount < 2)
        return;

    if (d->extended) {
        d->extended->drawPolygon(points, pointCount, QPaintEngine::ConvexMode);
        return;
    }

    d->updateState(d->state);

    uint emulationSpecifier = d->state->emulationSpecifier;

    if (emulationSpecifier) {
        QPainterPath polygonPath(points[0]);
        for (int i=1; i<pointCount; ++i)
            polygonPath.lineTo(points[i]);
        polygonPath.closeSubpath();
        polygonPath.setFillRule(Qt::WindingFill);
        d->draw_helper(polygonPath);
        return;
    }

    d->engine->drawPolygon(points, pointCount, QPaintEngine::ConvexMode);
}